

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O2

double __thiscall libDAI::IJGP::run(IJGP *this)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  size_type __n;
  undefined4 extraout_var_01;
  ulong uVar4;
  undefined4 extraout_var_02;
  undefined8 uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  Factor *pFVar6;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  size_t t;
  ulong uVar7;
  pointer pVVar8;
  size_t *psVar9;
  size_t *psVar10;
  size_t alpha;
  double dVar11;
  Real x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Diffs diffs;
  Factor nb;
  
  if ((this->Props).verbose != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&diffs,this);
    poVar2 = std::operator<<(poVar2,(string *)&diffs);
    std::operator<<(poVar2,"...");
    std::__cxx11::string::~string((string *)&diffs);
    if (2 < (this->Props).verbose) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  toc();
  iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                    ((long *)CONCAT44(extraout_var,iVar1));
  Diffs::Diffs(&diffs,lVar3,1.0);
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                  ((long *)CONCAT44(extraout_var_00,iVar1));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&old_beliefs,__n);
  uVar7 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var_01,iVar1));
    if (uVar4 <= uVar7) break;
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x30))
                      ((long *)CONCAT44(extraout_var_02,iVar1),uVar7);
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])(&nb,this,uVar5);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
               &old_beliefs,&nb);
    TFactor<double>::~TFactor(&nb);
    uVar7 = uVar7 + 1;
  }
  iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&edge_seq,
             *(long *)(CONCAT44(extraout_var_03,iVar1) + 0x118) -
             *(long *)(CONCAT44(extraout_var_03,iVar1) + 0x110) >> 4);
  pVVar8 = (pointer)0x0;
  while( true ) {
    nb._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar8;
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((pointer)(*(long *)(CONCAT44(extraout_var_04,iVar1) + 0x118) -
                  *(long *)(CONCAT44(extraout_var_04,iVar1) + 0x110) >> 4) <= pVVar8) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&edge_seq,(value_type_conflict2 *)&nb);
    pVVar8 = (pointer)((long)&(nb._vs._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start)->_label + 1);
  }
  uVar7 = 0;
  while (this->_iterations = uVar7, uVar7 < (this->Props).maxiter) {
    dVar11 = Diffs::max(&diffs);
    if (dVar11 <= (this->Props).tol) break;
    if ((this->Props).updates.v == SEQRND) {
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
    }
    uVar7 = 0;
    while( true ) {
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_05,iVar1) + 0x118) -
                  *(long *)(CONCAT44(extraout_var_05,iVar1) + 0x110) >> 4) <= uVar7) break;
      updateMessage(this,edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar7]);
      uVar7 = uVar7 + 1;
    }
    uVar7 = 0;
    while( true ) {
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_06,iVar1) + 0xe8) -
                  *(long *)(CONCAT44(extraout_var_06,iVar1) + 0xe0) >> 6) <= uVar7) break;
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::operator=
                ((this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,
                 (TFactor<double> *)
                 (uVar7 * 0x40 + *(long *)(CONCAT44(extraout_var_07,iVar1) + 0xe0)));
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      psVar10 = *(size_t **)(*(long *)(CONCAT44(extraout_var_08,iVar1) + 0x140) + uVar7 * 0x18);
      while( true ) {
        iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (psVar10 ==
            *(size_t **)(*(long *)(CONCAT44(extraout_var_09,iVar1) + 0x140) + 8 + uVar7 * 0x18))
        break;
        iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        psVar9 = *(size_t **)(*(long *)(CONCAT44(extraout_var_10,iVar1) + 0x158) + *psVar10 * 0x18);
        while( true ) {
          iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          if (psVar9 == *(size_t **)
                         (*(long *)(CONCAT44(extraout_var_11,iVar1) + 0x158) + 8 + *psVar10 * 0x18))
          break;
          if (*psVar9 != uVar7) {
            pFVar6 = message(this,*psVar9,*psVar10);
            TFactor<double>::operator*=
                      ((this->_Qa).
                       super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar7,pFVar6);
          }
          psVar9 = psVar9 + 1;
        }
        psVar10 = psVar10 + 1;
      }
      TProb<double>::normalize
                (&(this->_Qa).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7]._p,NORMPROB);
      uVar7 = uVar7 + 1;
    }
    uVar7 = 0;
    while( true ) {
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)((*(long *)(CONCAT44(extraout_var_12,iVar1) + 0x100) -
                  *(long *)(CONCAT44(extraout_var_12,iVar1) + 0xf8)) / 0x28) <= uVar7) break;
      TFactor<double>::TFactor(&nb);
      TFactor<double>::operator=
                ((this->_Qb).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,&nb);
      TFactor<double>::~TFactor(&nb);
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      psVar10 = *(size_t **)(*(long *)(CONCAT44(extraout_var_13,iVar1) + 0x158) + uVar7 * 0x18);
      while( true ) {
        iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (psVar10 ==
            *(size_t **)(*(long *)(CONCAT44(extraout_var_14,iVar1) + 0x158) + 8 + uVar7 * 0x18))
        break;
        pFVar6 = message(this,*psVar10,uVar7);
        TFactor<double>::operator*=
                  ((this->_Qb).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7,pFVar6);
        psVar10 = psVar10 + 1;
      }
      TProb<double>::normalize
                (&(this->_Qb).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7]._p,NORMPROB);
      uVar7 = uVar7 + 1;
    }
    lVar3 = 0;
    uVar7 = 0;
    while( true ) {
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar1) + 0x28))
                        ((long *)CONCAT44(extraout_var_15,iVar1));
      if (uVar4 <= uVar7) break;
      iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar1) + 0x30))
                        ((long *)CONCAT44(extraout_var_16,iVar1),uVar7);
      (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
                (&nb,this,uVar5);
      x = dist(&nb,(TFactor<double> *)
                   ((long)&((old_beliefs.
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar3),DISTLINF);
      Diffs::push(&diffs,x);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&((old_beliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3),&nb);
      TFactor<double>::~TFactor(&nb);
      uVar7 = uVar7 + 1;
      lVar3 = lVar3 + 0x38;
    }
    if (2 < (this->Props).verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,Name);
      std::operator<<(poVar2,"::run:  maxdiff ");
      dVar11 = Diffs::max(&diffs);
      poVar2 = std::ostream::_M_insert<double>(dVar11);
      poVar2 = std::operator<<(poVar2," after ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," passes");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar7 = this->_iterations + 1;
  }
  dVar11 = Diffs::max(&diffs);
  if (this->_maxdiff < dVar11) {
    dVar11 = Diffs::max(&diffs);
    this->_maxdiff = dVar11;
  }
  if ((this->Props).verbose != 0) {
    dVar11 = Diffs::max(&diffs);
    uVar7 = (this->Props).verbose;
    if (dVar11 <= (this->Props).tol) {
      if (uVar7 < 3) goto LAB_004e7e9b;
      poVar2 = std::operator<<((ostream *)&std::cout,Name);
      poVar2 = std::operator<<(poVar2,"::run:  converged in ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," passes (");
      toc();
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2," clocks).");
    }
    else {
      if (uVar7 == 1) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,Name);
      poVar2 = std::operator<<(poVar2,"::run:  WARNING: not converged within ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," passes (");
      toc();
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::operator<<(poVar2," clocks)...final maxdiff:");
      dVar11 = Diffs::max(&diffs);
      poVar2 = std::ostream::_M_insert<double>(dVar11);
    }
    std::endl<char,std::char_traits<char>>(poVar2);
  }
LAB_004e7e9b:
  dVar11 = Diffs::max(&diffs);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&old_beliefs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&diffs);
  return dVar11;
}

Assistant:

double IJGP::run() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << "...";
        if( Props.verbose >= 3)
           cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        vector<size_t> edge_seq;
//      vector<double> residuals;

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back( belief( grm().var(i) ) );

/*      if( Props.updates == UpdateType::SEQMAX ) {
            // do the first pass
            for(size_t iI = 0; iI < grm().nrEdges(); iI++ )
                calcNewMessage(iI);

            // calculate initial residuals
            residuals.reserve(grm().nrEdges());
            for( size_t iI = 0; iI < grm().nrEdges(); iI++ )
                residuals.push_back( dist( _newmessages[iI], _messages[iI], Prob::DISTLINF ) );
        } else {*/
            edge_seq.reserve( grm().nr_Redges() );
            for( size_t e = 0; e < grm().nr_Redges(); e++ )
                edge_seq.push_back( e );
//        }

        // IJGP with parent->child message updates
        // Do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
/*          if( Props.updates == UpdateType::SEQMAX ) {
                // Residuals-BP by Koller et al.
                for( size_t t = 0; t < grm().nrEdges(); t++ ) {
                    // update the message with the largest residual
                    size_t iI = max_element(residuals.begin(), residuals.end()) - residuals.begin();
                    updateMessage( iI );
                    residuals[iI] = 0;

                    // I->i has been updated, which means that residuals for all
                    // J->j with J in nb[i]\I and j in nb[J]\i have to be updated
                    size_t i = grm().edge(iI).first;
                    size_t I = grm().edge(iI).second;
                    for( FactorGraph::nb_cit J = grm().nbV(i).begin(); J != grm().nbV(i).end(); J++ )
                        if( *J != I )
                            for( FactorGraph::nb_cit j = grm().nbF(*J).begin(); j != grm().nbF(*J).end(); j++ )
                                if( *j != i ) {
                                    size_t jJ = grm().edge(*j,*J);
                                    calcNewMessage(jJ);
                                    residuals[jJ] = dist( _newmessages[jJ], _messages[jJ], Prob::DISTLINF );
                                }
                }
            } else if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    updateMessage(t);
            } else {*/
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );

                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    updateMessage( edge_seq[t] );
//            }

            // Calc outer region beliefs
            for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
                _Qa[alpha] = grm().OR(alpha);
                for( RegionGraph::R_nb_cit beta2 = grm().nbOR(alpha).begin(); beta2 != grm().nbOR(alpha).end(); beta2++ )
                    for( RegionGraph::R_nb_cit alpha2 = grm().nbIR(*beta2).begin(); alpha2 != grm().nbIR(*beta2).end(); alpha2++ )
                        if( *alpha2 != alpha )
                            _Qa[alpha] *= message(*alpha2, *beta2);
                _Qa[alpha].normalize();
            }

            // Calc inner region beliefs
            for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) {
                _Qb[beta] = Factor();
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ )
                    _Qb[beta] *= message(*alpha, beta);
                _Qb[beta].normalize();
            }

            // Calculate new variable beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( belief( grm().var(i) ) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }

            if( Props.verbose >= 3 )
                cout << Name << "::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Props.verbose >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Props.verbose == 1 )
                    cout << endl;
                    cout << Name << "::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Props.verbose >= 3 )
                    cout << Name << "::run:  converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }